

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_compare.cpp
# Opt level: O1

bool operator<(wchar_t *lhs,ON_wString *rhs)

{
  int iVar1;
  wchar_t *string2;
  
  string2 = ON_wString::operator_cast_to_wchar_t_(rhs);
  iVar1 = ON_wString::Length(rhs);
  iVar1 = ON_StringCompareOrdinalUTF32((ON__UINT32 *)lhs,-1,(ON__UINT32 *)string2,iVar1,false);
  return SUB41((uint)iVar1 >> 0x1f,0);
}

Assistant:

bool operator<( const wchar_t* lhs, const ON_wString& rhs )
{
  const int rc = ON_wString::CompareOrdinal(
    lhs,
    -1,
    static_cast<const wchar_t*>(rhs),
    rhs.Length(),
    false
    );
  return (rc < 0);
}